

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<int>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  DataChunk *pDVar1;
  uint uVar2;
  CURSOR *pCVar3;
  bool bVar4;
  bool bVar5;
  reference pvVar6;
  double dVar7;
  undefined1 auVar8 [12];
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar3 = accessor->data;
  bVar4 = (pCVar3->scan).next_row_index <= lidx;
  bVar5 = lidx < (pCVar3->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar5 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (int *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
    }
    uVar2 = pCVar3->data[(uint)((int)lidx - (int)(pCVar3->scan).current_row_index)];
    bVar5 = TryCast::Operation<int,double>(uVar2,&local_60,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,double>(&local_58,(duckdb *)(ulong)uVar2,auVar8._8_4_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (bVar5 || bVar4) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (int *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
    }
    uVar2 = pCVar3->data[(uint)((int)lidx - (int)(pCVar3->scan).current_row_index)];
    bVar5 = TryCast::Operation<int,double>(uVar2,&local_60,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,double>(&local_58,(duckdb *)(ulong)uVar2,auVar8._8_4_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_38 = local_60;
    pCVar3 = accessor->data;
    if (((pCVar3->scan).next_row_index <= hidx) || (hidx < (pCVar3->scan).current_row_index)) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,hidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (int *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
    }
    uVar2 = pCVar3->data[(uint)((int)hidx - (int)(pCVar3->scan).current_row_index)];
    bVar5 = TryCast::Operation<int,double>(uVar2,&local_60,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,double>(&local_58,(duckdb *)(ulong)uVar2,auVar8._8_4_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,&local_58);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    dVar7 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar7 * local_60 + local_38 * (1.0 - dVar7);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}